

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O2

void load_keymap(void)

{
  byte bVar1;
  int iVar2;
  nh_cmd_desc *pnVar3;
  wchar_t wVar4;
  nh_bool nVar5;
  int iVar6;
  uint uVar7;
  void *__src;
  long lVar8;
  size_t sVar9;
  __off_t _Var10;
  char *__buf;
  byte *pbVar11;
  ushort **ppuVar12;
  nh_cmd_desc *pnVar13;
  nh_cmd_desc *pnVar14;
  nh_cmd_desc **ppnVar15;
  long lVar16;
  nh_cmd_desc *__dest;
  char *__s;
  ulong uVar17;
  byte *pbVar18;
  byte *cmdname;
  byte *local_140;
  fnchar filename [256];
  
  __src = (void *)nh_get_commands(&cmdcount);
  lVar8 = (long)cmdcount;
  commandlist = (nh_cmd_desc *)malloc(lVar8 * 0x6c);
  memcpy(commandlist,__src,lVar8 * 0x6c);
  init_keymap();
  filename[0] = '\0';
  nVar5 = get_gamedir(CONFIG_DIR,filename);
  if (nVar5 != '\0') {
    sVar9 = strlen(filename);
    builtin_memcpy(filename + sVar9,"keymap.conf",0xc);
    iVar6 = open(filename,0,0);
    if (iVar6 != -1) {
      _Var10 = lseek(iVar6,0,2);
      lseek(iVar6,0,0);
      iVar2 = (int)_Var10;
      __buf = (char *)malloc((long)(iVar2 + 1));
      read(iVar6,__buf,(long)iVar2);
      __buf[iVar2] = '\0';
      close(iVar6);
      unknown_count = L'\0';
      memset(unknown_keymap,0,0xff8);
      __s = __buf;
LAB_0010abd1:
      pbVar11 = (byte *)strtok(__s,"\r\n");
      if (pbVar11 != (byte *)0x0) {
        lVar8 = 0;
        pbVar18 = pbVar11;
        while ((bVar1 = pbVar11[lVar8], (ulong)bVar1 != 0 &&
               (ppuVar12 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar12 + (ulong)bVar1 * 2 + 1) & 0x20) == 0))) {
          lVar8 = lVar8 + 1;
          pbVar18 = pbVar18 + 1;
        }
        do {
          cmdname = pbVar18;
          bVar1 = *cmdname;
          if ((ulong)bVar1 == 0) break;
          ppuVar12 = __ctype_b_loc();
          pbVar18 = cmdname + 1;
        } while ((*(byte *)((long)*ppuVar12 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        pnVar13 = find_command((char *)cmdname);
        wVar4 = unknown_count;
        pnVar3 = unknown_commands;
        __dest = pnVar13;
        if (pnVar13 == (nh_cmd_desc *)0x0) goto code_r0x0010ac44;
        goto LAB_0010ac92;
      }
      free(__buf);
    }
  }
  return;
code_r0x0010ac44:
  __s = (char *)0x0;
  if (bVar1 != 0x2d) {
    lVar8 = (long)unknown_count;
    pnVar14 = unknown_commands;
    if (unknown_size <= unknown_count) {
      uVar17 = (ulong)(uint)(unknown_size * 2);
      if (unknown_size * 2 < 0x11) {
        uVar17 = 0x10;
      }
      unknown_size = (wchar_t)uVar17;
      pnVar14 = (nh_cmd_desc *)realloc(unknown_commands,uVar17 * 0x6c);
      unknown_commands = pnVar14;
      memset(pnVar14 + lVar8,0,(long)((wchar_t)uVar17 - wVar4) * 0x6c);
      for (lVar16 = 0; lVar16 != 0xff8; lVar16 = lVar16 + 8) {
        if (*(long *)((long)unknown_keymap + lVar16) != 0) {
          *(long *)((long)unknown_keymap + lVar16) =
               (long)pnVar14 + (*(long *)((long)unknown_keymap + lVar16) - (long)pnVar3);
        }
      }
    }
    unknown_count = wVar4 + L'\x01';
    __dest = pnVar14 + lVar8;
    strncpy(__dest->name,(char *)cmdname,0x14);
    pnVar14[lVar8].name[0x13] = '\0';
LAB_0010ac92:
    if (((*pbVar11 == 0x45) && (pbVar11[1] == 0x58)) && (pbVar11[2] == 0x54)) {
      pbVar11 = (byte *)((long)&__dest->flags + 1);
      *pbVar11 = *pbVar11 | 4;
      __s = (char *)0x0;
    }
    else {
      iVar6 = strncmp((char *)pbVar11,"NOEXT",5);
      if (iVar6 == 0) {
        pbVar11 = (byte *)((long)&__dest->flags + 1);
        *pbVar11 = *pbVar11 & 0xfb;
        __s = (char *)0x0;
      }
      else {
        lVar8 = strtol((char *)pbVar11,(char **)&local_140,0x10);
        uVar7 = (uint)lVar8;
        if ((uVar7 == 0) || (local_140 == pbVar11)) {
          curses_msgwin("Bad/damaged keymap.conf. Reverting to defaults.");
          init_keymap();
          return;
        }
        __s = (char *)0x0;
        if (uVar7 < 0x1ff) {
          if (pnVar13 == (nh_cmd_desc *)0x0) {
            ppnVar15 = unknown_keymap;
          }
          else {
            ppnVar15 = keymap;
          }
          ppnVar15[uVar7 & 0x1ff] = __dest;
          __s = (char *)0x0;
        }
      }
    }
  }
  goto LAB_0010abd1;
}

Assistant:

void load_keymap(void)
{
    struct nh_cmd_desc *cmdlist = nh_get_commands(&cmdcount);
    
    commandlist = malloc(cmdcount * sizeof(struct nh_cmd_desc));
    memcpy(commandlist, cmdlist, cmdcount * sizeof(struct nh_cmd_desc));

    /* always init the keymap - read keymap might not set up every mapping */
    init_keymap();
    read_keymap();
}